

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O2

TestCaseGroup * vkt::image::createImageSizeTests(TestContext *testCtx)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  TestCaseGroup *pTVar4;
  TestNode *node;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  ImageType imageType;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  undefined1 local_1ec [12];
  string local_1e0;
  ostringstream str;
  Texture texture;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,"image_size","imageSize() cases");
  lVar11 = 0;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  do {
    pTVar4 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    if (lVar11 == 8) {
      testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      .ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&testGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar4;
    }
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    uVar1 = (&(anonymous_namespace)::s_imageTypes)[lVar11];
    getImageTypeName_abi_cxx11_((string *)&str,(image *)(ulong)uVar1,imageType);
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,_str,"");
    imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar4;
    std::__cxx11::string::~string((string *)&str);
    for (lVar9 = 0;
        pTVar4 = imageGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar9 != 3; lVar9 = lVar9 + 1) {
      pcVar6 = "readonly_";
      if (lVar9 == 1) {
        pcVar6 = "";
      }
      pcVar7 = "writeonly_";
      if (lVar9 == 0) {
        pcVar7 = "";
      }
      for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
        if (uVar1 < 8) {
          pTVar4 = (TestCaseGroup *)
                   (*(code *)(&DAT_009af370 + *(int *)(&DAT_009af370 + (ulong)uVar1 * 4)))();
          return pTVar4;
        }
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&str);
        Texture::Texture(&texture,IMAGE_TYPE_LAST,(IVec3 *)&str,0,1);
        pTVar4 = imageGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        node = (TestNode *)operator_new(0x90);
        uVar2 = (&(anonymous_namespace)::s_flags)[lVar9];
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
        poVar5 = std::operator<<((ostream *)&str,pcVar6);
        std::operator<<(poVar5,pcVar7);
        uVar3 = Texture::dimension(&texture);
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          pcVar10 = "x";
          if (uVar8 == 0) {
            pcVar10 = "";
          }
          poVar5 = std::operator<<((ostream *)&str,pcVar10);
          Texture::size((Texture *)local_1ec);
          std::ostream::operator<<(poVar5,*(int *)(local_1ec + uVar8 * 4));
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&str,"",(allocator<char> *)local_1ec);
        TestCase::TestCase((TestCase *)node,testCtx,(string *)(local_1ec + 0xc),(string *)&str);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bd96e8;
        Texture::Texture((Texture *)(node + 1),&texture);
        *(undefined4 *)&node[1].m_name._M_string_length = 0x6d;
        *(byte *)((long)&node[1].m_name._M_string_length + 4) = (byte)uVar2 & 1;
        *(byte *)((long)&node[1].m_name._M_string_length + 5) = (byte)uVar2 >> 1 & 1;
        tcu::TestNode::addChild(&pTVar4->super_TestNode,node);
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)(local_1ec + 0xc));
      }
    }
    imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&imageGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_size", "imageSize() cases"));

	const VkFormat format = VK_FORMAT_R32G32B32A32_SFLOAT;

	for (int imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(s_imageTypes); ++imageTypeNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(s_imageTypes[imageTypeNdx]).c_str(), ""));

		for (int flagNdx = 0; flagNdx < DE_LENGTH_OF_ARRAY(s_flags); ++flagNdx)
		for (int imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(s_baseImageSizes); ++imageSizeNdx)
		{
			const Texture texture = getTexture(s_imageTypes[imageTypeNdx], s_baseImageSizes[imageSizeNdx]);
			imageGroup->addChild(new SizeTest(testCtx, getCaseName(texture, s_flags[flagNdx]), "", texture, format, s_flags[flagNdx]));
		}

		testGroup->addChild(imageGroup.release());
	}
	return testGroup.release();
}